

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O2

string * __thiscall
phosg::name_for_pid_abi_cxx11_(string *__return_storage_ptr__,phosg *this,pid_t pid)

{
  int iVar1;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  string command;
  allocator<char> local_82;
  allocator<char> local_81;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> local_80;
  string local_70;
  string local_50;
  string local_30;
  
  string_printf_abi_cxx11_
            (&local_30,"ps -ax -c -o pid -o command | grep ^\\ *%u\\ | sed s/[0-9]*\\ //g",
             (ulong)this & 0xffffffff);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,local_30._M_dataplus._M_p,&local_81);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"r",&local_82);
  popen_unique((phosg *)&local_80,&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    iVar1 = fgetc((FILE *)local_80._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
    if (iVar1 == -1) break;
    if (iVar1 - 0x20U < 0x5f) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,(char)iVar1);
    }
  }
  ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr(&local_80);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string name_for_pid(pid_t pid) {
  string command = string_printf("ps -ax -c -o pid -o command | grep ^\\ *%u\\ | sed s/[0-9]*\\ //g", pid);
  auto f = popen_unique(command.c_str(), "r");

  string name;

  int ch;
  while ((ch = fgetc(f.get())) != EOF) {
    if (ch >= 0x20 && ch < 0x7F) {
      name += ch;
    }
  }

  return name;
}